

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-type.c
# Opt level: O3

coda_mem_special *
coda_mem_time_new(coda_type_special *definition,coda_dynamic_type *attributes,
                 coda_dynamic_type *base_type)

{
  coda_mem_special *type;
  coda_mem_record *pcVar1;
  undefined8 uVar2;
  char *message;
  
  if (definition == (coda_type_special *)0x0) {
    message = "definition argument is NULL (%s:%u)";
    uVar2 = 0x3be;
  }
  else if (definition->type_class == coda_special_class) {
    if (definition->special_type == coda_special_time) {
      if (definition->base_type == base_type->definition) {
        type = (coda_mem_special *)malloc(0x28);
        if (type == (coda_mem_special *)0x0) {
          coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x28,
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                         ,0x3d6);
          return (coda_mem_special *)0x0;
        }
        type->backend = coda_backend_memory;
        type->definition = definition;
        definition->retain_count = definition->retain_count + 1;
        type->tag = tag_mem_special;
        type->attributes = attributes;
        type->base_type = base_type;
        if (attributes != (coda_dynamic_type *)0x0) {
          return type;
        }
        if (definition->attributes == (coda_type_record *)0x0) {
          return type;
        }
        pcVar1 = coda_mem_record_new(definition->attributes,(coda_dynamic_type *)0x0);
        type->attributes = (coda_dynamic_type *)pcVar1;
        if (pcVar1 != (coda_mem_record *)0x0) {
          return type;
        }
        coda_mem_type_delete((coda_dynamic_type *)type);
        return (coda_mem_special *)0x0;
      }
      message = "definition of base type should be the same as base type of definition (%s:%u)";
      uVar2 = 0x3ce;
    }
    else {
      message = "definition is not a time type (%s:%u)";
      uVar2 = 0x3c8;
    }
  }
  else {
    message = "definition is not a special type (%s:%u)";
    uVar2 = 0x3c3;
  }
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                 ,uVar2);
  return (coda_mem_special *)0x0;
}

Assistant:

coda_mem_special *coda_mem_time_new(coda_type_special *definition, coda_dynamic_type *attributes,
                                    coda_dynamic_type *base_type)
{
    coda_mem_special *type;

    if (definition == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "definition argument is NULL (%s:%u)", __FILE__, __LINE__);
        return NULL;
    }
    if (definition->type_class != coda_special_class)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "definition is not a special type (%s:%u)", __FILE__, __LINE__);
        return NULL;
    }
    if (((coda_type_special *)definition)->special_type != coda_special_time)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "definition is not a time type (%s:%u)", __FILE__, __LINE__);
        return NULL;
    }
    if (((coda_type_special *)definition)->base_type != base_type->definition)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "definition of base type should be the same as base type of "
                       "definition (%s:%u)", __FILE__, __LINE__);
        return NULL;
    }

    type = (coda_mem_special *)malloc(sizeof(coda_mem_special));
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_mem_special), __FILE__, __LINE__);
        return NULL;
    }
    type->backend = coda_backend_memory;
    type->definition = definition;
    definition->retain_count++;
    type->tag = tag_mem_special;
    type->attributes = attributes;
    type->base_type = base_type;

    if (type->attributes == NULL)
    {
        if (create_attributes_record((coda_mem_type *)type) != 0)
        {
            coda_mem_type_delete((coda_dynamic_type *)type);
            return NULL;
        }
    }

    return type;
}